

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O3

void __thiscall SAUF<TTA>::PerformLabeling(SAUF<TTA> *this)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long local_c0;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar11 = *(uint *)&pMVar4->field_0x8;
  uVar2 = *(uint *)&pMVar4->field_0xc;
  cv::Mat::Mat(local_b8,**(int **)&pMVar4->field_0x40,(*(int **)&pMVar4->field_0x40)[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  uVar13 = 1;
  if (0 < (int)uVar11) {
    local_c0 = -1;
    uVar12 = 0;
    do {
      if (0 < (int)uVar2) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar10 = *(long *)&pMVar4->field_0x10;
        lVar16 = **(long **)&pMVar4->field_0x48;
        lVar17 = lVar16 * uVar12 + lVar10;
        lVar9 = *(long *)&pMVar5->field_0x10;
        lVar18 = **(long **)&pMVar5->field_0x48;
        lVar15 = lVar18 * uVar12 + lVar9;
        lVar9 = lVar18 * local_c0 + lVar9;
        lVar10 = lVar10 + lVar16 * local_c0;
        lVar18 = 0;
        lVar16 = -1;
        do {
          if (*(char *)(lVar17 + 1 + lVar16) != '\0') {
            if (uVar12 == 0) {
              lVar7 = lVar16;
              if (lVar16 != -1) {
LAB_001cdab3:
                if (*(char *)(lVar17 + lVar7) != '\0') {
                  uVar13 = *(uint *)(lVar15 + lVar7 * 4);
                  goto LAB_001cdb33;
                }
              }
LAB_001cdb03:
              uVar8 = (ulong)TTA::length_;
              TTA::rtable_[uVar8] = TTA::length_;
              TTA::next_[uVar8] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar13 = TTA::length_;
              TTA::length_ = TTA::length_ + 1;
            }
            else if (*(char *)(lVar10 + 1 + lVar16) == '\0') {
              if ((lVar16 + 1 < (long)(int)uVar2 + -1) && (*(char *)(lVar10 + 2 + lVar16) != '\0'))
              {
                if (lVar16 == -1) {
LAB_001cdba1:
                  uVar13 = *(uint *)(lVar9 + 8 + lVar16 * 4);
                }
                else {
                  if (*(char *)(lVar10 + lVar16) == '\0') {
                    if (*(char *)(lVar17 + lVar16) == '\0') goto LAB_001cdba1;
                    uVar13 = *(uint *)(lVar15 + lVar16 * 4);
                  }
                  else {
                    uVar13 = *(uint *)(lVar9 + lVar16 * 4);
                  }
                  uVar13 = TTA::Merge(uVar13,*(uint *)(lVar9 + 8 + lVar16 * 4));
                }
              }
              else {
                if (lVar16 == -1) goto LAB_001cdb03;
                if (*(char *)(lVar10 + lVar16) == '\0') {
                  lVar7 = lVar18 + -1;
                  goto LAB_001cdab3;
                }
                uVar13 = *(uint *)(lVar9 + lVar16 * 4);
              }
            }
            else {
              uVar13 = *(uint *)(lVar9 + 4 + lVar16 * 4);
            }
LAB_001cdb33:
            *(uint *)(lVar15 + 4 + lVar16 * 4) = uVar13;
          }
          lVar18 = lVar18 + 1;
          lVar7 = lVar16 - (ulong)uVar2;
          lVar16 = lVar16 + 1;
        } while (lVar7 != -2);
      }
      puVar6 = TTA::rtable_;
      uVar12 = uVar12 + 1;
      local_c0 = local_c0 + 1;
    } while (uVar12 != uVar11);
    uVar13 = 1;
    if (1 < TTA::length_) {
      uVar12 = 1;
      do {
        if (uVar12 == puVar6[uVar12]) {
          uVar13 = uVar13 + 1;
          uVar11 = uVar13;
        }
        else {
          uVar11 = puVar6[puVar6[uVar12]];
        }
        puVar6[uVar12] = uVar11;
        uVar12 = uVar12 + 1;
      } while (uVar12 < TTA::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
  puVar6 = TTA::rtable_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar14 = *(int *)&pMVar5->field_0x8;
  if (0 < iVar14) {
    lVar10 = *(long *)&pMVar5->field_0x10;
    lVar16 = **(long **)&pMVar5->field_0x48;
    lVar9 = 0;
    do {
      iVar3 = *(int *)&pMVar5->field_0xc;
      if ((long)iVar3 != 0) {
        lVar18 = 0;
        do {
          *(uint *)(lVar10 + lVar18) = puVar6[*(uint *)(lVar10 + lVar18)];
          lVar18 = lVar18 + 4;
        } while ((long)iVar3 * 4 != lVar18);
        iVar14 = *(int *)&pMVar5->field_0x8;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + lVar16;
    } while (lVar9 < iVar14);
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size(), 0); // Allocation + initialization of the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned * img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned * const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }

        LabelsSolver::Dealloc(); // Memory deallocation of the labels solver

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }